

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O3

void __thiscall DatasetBuilder::clear(DatasetBuilder *this)

{
  pointer puVar1;
  pointer puVar2;
  IndexBuilder *pIVar3;
  IndexType *pIVar4;
  FlatIndexBuilder *in_RAX;
  FlatIndexBuilder *pFVar5;
  runtime_error *this_00;
  pointer *__ptr;
  pointer puVar6;
  IndexType *pIVar7;
  _Head_base<0UL,_FlatIndexBuilder_*,_false> local_38;
  
  puVar1 = (this->indices).
           super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->indices).
           super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = puVar1;
  local_38._M_head_impl = in_RAX;
  if (puVar2 != puVar1) {
    do {
      pIVar3 = (puVar6->_M_t).
               super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>._M_t.
               super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
               super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl;
      if (pIVar3 != (IndexBuilder *)0x0) {
        (*pIVar3->_vptr_IndexBuilder[1])();
      }
      (puVar6->_M_t).super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>._M_t.
      super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
      super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl = (IndexBuilder *)0x0;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
    (this->indices).
    super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->fids,
                    (this->fids).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pIVar7 = (this->index_types).super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar4 = (this->index_types).super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pIVar7 != pIVar4) {
    do {
      if (this->builder_type == BITMAP) {
        pFVar5 = (FlatIndexBuilder *)operator_new(0x28);
        BitmapIndexBuilder::BitmapIndexBuilder((BitmapIndexBuilder *)pFVar5,*pIVar7);
        local_38._M_head_impl = pFVar5;
        std::
        vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>
        ::emplace_back<std::unique_ptr<BitmapIndexBuilder,std::default_delete<BitmapIndexBuilder>>>
                  ((vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>
                    *)&this->indices,
                   (unique_ptr<BitmapIndexBuilder,_std::default_delete<BitmapIndexBuilder>_> *)
                   &local_38);
      }
      else {
        if (this->builder_type != FLAT) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"unhandled builder type");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pFVar5 = (FlatIndexBuilder *)operator_new(0x30);
        FlatIndexBuilder::FlatIndexBuilder(pFVar5,*pIVar7);
        local_38._M_head_impl = pFVar5;
        std::
        vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>
        ::emplace_back<std::unique_ptr<FlatIndexBuilder,std::default_delete<FlatIndexBuilder>>>
                  ((vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>
                    *)&this->indices,
                   (unique_ptr<FlatIndexBuilder,_std::default_delete<FlatIndexBuilder>_> *)&local_38
                  );
      }
      if (local_38._M_head_impl != (FlatIndexBuilder *)0x0) {
        (*((local_38._M_head_impl)->super_IndexBuilder)._vptr_IndexBuilder[1])();
      }
      pIVar7 = pIVar7 + 1;
    } while (pIVar7 != pIVar4);
  }
  return;
}

Assistant:

void DatasetBuilder::clear() {
    indices.clear();
    fids.clear();

    for (const auto &index_type : index_types) {
        if (builder_type == BuilderType::FLAT) {
            indices.emplace_back(
                std::make_unique<FlatIndexBuilder>(index_type));
        } else if (builder_type == BuilderType::BITMAP) {
            indices.emplace_back(
                std::make_unique<BitmapIndexBuilder>(index_type));
        } else {
            throw std::runtime_error("unhandled builder type");
        }
    }
}